

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonAncestors
          (DOMRangeImpl *this,DOMNode *startAncestor,DOMNode *endAncestor,int how)

{
  bool bVar1;
  int iVar2;
  DOMDocumentFragment *pDVar3;
  undefined4 extraout_var_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar6;
  DOMRangeImpl *pDVar7;
  DOMRangeImpl *this_00;
  int iVar8;
  undefined4 extraout_var;
  
  if (how == 3) {
    traverseLeftBoundary(this,startAncestor,3);
  }
  else {
    iVar2 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    pDVar3 = (DOMDocumentFragment *)CONCAT44(extraout_var,iVar2);
    pDVar6 = traverseLeftBoundary(this,startAncestor,how);
    if (pDVar3 != (DOMDocumentFragment *)0x0) {
      (*(pDVar3->super_DOMNode)._vptr_DOMNode[0x11])(pDVar3,pDVar6);
      bVar1 = false;
      goto LAB_0027c0a8;
    }
  }
  bVar1 = true;
  pDVar3 = (DOMDocumentFragment *)0x0;
LAB_0027c0a8:
  pDVar7 = (DOMRangeImpl *)startAncestor;
  iVar2 = (*startAncestor->_vptr_DOMNode[5])();
  XVar4 = indexOf(pDVar7,startAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar2));
  XVar5 = indexOf(pDVar7,endAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar2));
  iVar2 = (*startAncestor->_vptr_DOMNode[10])(startAncestor);
  if (0 < (int)(~(uint)XVar4 + (int)XVar5)) {
    iVar8 = (int)XVar5 - (uint)XVar4;
    pDVar7 = (DOMRangeImpl *)CONCAT44(extraout_var_01,iVar2);
    do {
      this_00 = pDVar7;
      iVar2 = (*(pDVar7->super_DOMRange)._vptr_DOMRange[10])();
      pDVar6 = traverseFullySelected(this_00,(DOMNode *)pDVar7,how);
      if (!bVar1) {
        (*(pDVar3->super_DOMNode)._vptr_DOMNode[0x11])(pDVar3,pDVar6);
      }
      iVar8 = iVar8 + -1;
      pDVar7 = (DOMRangeImpl *)CONCAT44(extraout_var_02,iVar2);
    } while (1 < iVar8);
  }
  pDVar6 = traverseRightBoundary(this,endAncestor,how);
  if (!bVar1) {
    (*(pDVar3->super_DOMNode)._vptr_DOMNode[0x11])(pDVar3,pDVar6);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return pDVar3;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonAncestors( DOMNode*startAncestor, DOMNode*endAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();

    DOMNode*n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    DOMNode*commonParent = startAncestor->getParentNode();
    XMLSize_t startOffset = indexOf( startAncestor, commonParent );
    XMLSize_t endOffset = indexOf( endAncestor, commonParent );
    ++startOffset;

    int cnt = (int)endOffset - (int)startOffset;
    DOMNode* sibling = startAncestor->getNextSibling();

    while( cnt > 0 )
    {
        DOMNode* nextSibling = sibling->getNextSibling();
        n = traverseFullySelected( sibling, how );
        if ( frag!=0 )
            frag->appendChild( n );
        sibling = nextSibling;
        --cnt;
    }

    n = traverseRightBoundary( endAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }
    return frag;
}